

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log_Entry.h
# Opt level: O2

void __thiscall Nova::Log::Log_Entry::~Log_Entry(Log_Entry *this)

{
  this->_vptr_Log_Entry = (_func_int **)&PTR__Log_Entry_00148710;
  std::__cxx11::string::~string((string *)&this->name);
  return;
}

Assistant:

virtual ~Log_Entry() {}